

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwhatsthis.cpp
# Opt level: O2

void __thiscall QWhatsThat::~QWhatsThat(QWhatsThat *this)

{
  *(undefined ***)&this->super_QWidget = &PTR_metaObject_007c6ae0;
  *(undefined ***)&(this->super_QWidget).super_QPaintDevice = &PTR__QWhatsThat_007c6c90;
  instance = (QWhatsThat *)0x0;
  if (this->doc != (QTextDocument *)0x0) {
    (**(code **)(*(long *)this->doc + 0x20))();
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->anchor).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->text).d);
  QWeakPointer<QObject>::~QWeakPointer(&(this->widget).wp);
  QWidget::~QWidget(&this->super_QWidget);
  return;
}

Assistant:

QWhatsThat::~QWhatsThat()
{
    instance = nullptr;
    if (doc)
        delete doc;
}